

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::point3f> *value)

{
  bool bVar1;
  float3 v;
  array<float,_3UL> local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<float,3ul>(this,&local_20);
    if (bVar1) {
      *(undefined8 *)&value->contained = local_20._M_elems._0_8_;
      *(float *)((long)&value->contained + 8) = local_20._M_elems[2];
      bVar1 = true;
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::point3f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::point3f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}